

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O0

void penguinV::ExtractChannel
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,uint8_t channelId)

{
  uint8_t uVar1;
  bool bVar2;
  ImageTypeManager *this;
  FunctionTableHolder *pFVar3;
  reference puVar4;
  ImageTemplate<unsigned_char> *in_RCX;
  uint in_EDX;
  uint in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint in_R8D;
  uint in_R9D;
  uint in_stack_00000008;
  uint in_stack_00000010;
  uchar in_stack_00000018;
  ImageManager manager;
  ExtractChannelForm4 funcTemp;
  const_iterator type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *types;
  uint8_t imageType;
  ExtractChannelForm4 func;
  ImageTypeManager *registrator;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  uint8_t requiredType;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffee0;
  ImageManager *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  uint8_t in_stack_ffffffffffffff0f;
  ImageTypeManager *in_stack_ffffffffffffff10;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  undefined1 local_68 [24];
  undefined1 *local_50;
  undefined7 in_stack_ffffffffffffffb8;
  ExtractChannelForm4 func_00;
  ExtractChannelForm4 p_Var5;
  
  this = ImageTypeManager::instance();
  PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  pFVar3 = ImageTypeManager::functionTable(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0f);
  func_00 = pFVar3->ExtractChannel;
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  if ((func_00 == (ExtractChannelForm4)0x0) &&
     (bVar2 = ImageTypeManager::isIntertypeConversionEnabled(this), bVar2)) {
    ImageTypeManager::imageTypes
              ((ImageTypeManager *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    local_50 = local_68;
    local_70._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    while( true ) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator*(&local_70);
      pFVar3 = ImageTypeManager::functionTable(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0f);
      p_Var5 = pFVar3->ExtractChannel;
      if (p_Var5 != (ExtractChannelForm4)0x0) {
        puVar4 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&local_70);
        uVar1 = *puVar4;
        func_00 = p_Var5;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&local_70);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffffee0);
  }
  requiredType = (uint8_t)((uint)in_stack_fffffffffffffecc >> 0x18);
  (anonymous_namespace)::
  verifyFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,unsigned_char)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_uchar
              *)func_00,(char *)CONCAT17(uVar1,in_stack_ffffffffffffffb8));
  anon_unknown.dwarf_9a3be::ImageManager::ImageManager
            ((ImageManager *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             requiredType);
  (*func_00)(in_RDI,in_ESI,in_EDX,in_RCX,in_R8D,in_R9D,in_stack_00000008,in_stack_00000010,
             in_stack_00000018);
  anon_unknown.dwarf_9a3be::ImageManager::~ImageManager(in_stack_ffffffffffffff00);
  return;
}

Assistant:

void ExtractChannel( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut,
                         uint32_t startYOut, uint32_t width, uint32_t height, uint8_t channelId )
    {
        initialize( in, ExtractChannel )
        func( in, startXIn, startYIn, out, startXOut, startYOut, width, height, channelId );
    }